

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.c
# Opt level: O0

void read_route(route_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  route_type_t rVar2;
  long lVar3;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  route_t *record_local;
  
  init_route(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"route_id");
    if (iVar1 == 0) {
      strcpy(record->id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"agency_id");
      if (iVar1 == 0) {
        strcpy(record->agency_id,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"route_short_name");
        if (iVar1 == 0) {
          strcpy(record->short_name,field_values[local_2c]);
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"route_long_name");
          if (iVar1 == 0) {
            strcpy(record->long_name,field_values[local_2c]);
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"route_desc");
            if (iVar1 == 0) {
              strcpy(record->desc,field_values[local_2c]);
            }
            else {
              iVar1 = strcmp(field_names[local_2c],"route_type");
              if (iVar1 == 0) {
                rVar2 = parse_route_type(field_values[local_2c]);
                record->type = rVar2;
              }
              else {
                iVar1 = strcmp(field_names[local_2c],"route_url");
                if (iVar1 == 0) {
                  strcpy(record->url,field_values[local_2c]);
                }
                else {
                  iVar1 = strcmp(field_names[local_2c],"route_color");
                  if (iVar1 == 0) {
                    strcpy(record->color,field_values[local_2c]);
                  }
                  else {
                    iVar1 = strcmp(field_names[local_2c],"route_text_color");
                    if (iVar1 == 0) {
                      strcpy(record->text_color,field_values[local_2c]);
                    }
                    else {
                      iVar1 = strcmp(field_names[local_2c],"route_sort_order");
                      if (iVar1 == 0) {
                        lVar3 = strtol(field_values[local_2c],(char **)0x0,0);
                        record->sort_order = (int)lVar3;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_route(route_t *record, int field_count, const char **field_names, const char **field_values) {
    init_route(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "route_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_id") == 0) {
            strcpy(record->agency_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_short_name") == 0) {
            strcpy(record->short_name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_long_name") == 0) {
            strcpy(record->long_name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_desc") == 0) {
            strcpy(record->desc, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_type") == 0) {
            record->type = parse_route_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_url") == 0) {
            strcpy(record->url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_color") == 0) {
            strcpy(record->color, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_text_color") == 0) {
            strcpy(record->text_color, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_sort_order") == 0) {
            record->sort_order = (int)strtol(field_values[i], NULL, 0);
            continue;
        }
    }
}